

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_verify_server_certificate(SSL_HANDSHAKE *hs)

{
  bool bVar1;
  ssl_verify_result_t sVar2;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
  if (!bVar1) {
    hs->state = 9;
    return ssl_hs_ok;
  }
  sVar2 = ssl_verify_peer_cert(hs);
  if (sVar2 != ssl_verify_ok) {
    if (sVar2 == ssl_verify_invalid) {
      return ssl_hs_error;
    }
    if (sVar2 == ssl_verify_retry) {
      hs->state = 7;
      return ssl_hs_certificate_verify;
    }
  }
  hs->state = 9;
  return ssl_hs_ok;
}

Assistant:

static enum ssl_hs_wait_t do_verify_server_certificate(SSL_HANDSHAKE *hs) {
  if (!ssl_cipher_uses_certificate_auth(hs->new_cipher)) {
    hs->state = state_read_server_key_exchange;
    return ssl_hs_ok;
  }

  switch (ssl_verify_peer_cert(hs)) {
    case ssl_verify_ok:
      break;
    case ssl_verify_invalid:
      return ssl_hs_error;
    case ssl_verify_retry:
      hs->state = state_verify_server_certificate;
      return ssl_hs_certificate_verify;
  }

  hs->state = state_read_server_key_exchange;
  return ssl_hs_ok;
}